

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.hh
# Opt level: O0

void __thiscall QPDFOutlineObjectHelper::~QPDFOutlineObjectHelper(QPDFOutlineObjectHelper *this)

{
  element_type *peVar1;
  shared_ptr<QPDFOutlineObjectHelper> local_20;
  QPDFOutlineObjectHelper *local_10;
  QPDFOutlineObjectHelper *this_local;
  
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFOutlineObjectHelper_0058fbf8;
  local_10 = this;
  std::shared_ptr<QPDFOutlineObjectHelper>::shared_ptr(&local_20,(nullptr_t)0x0);
  peVar1 = std::
           __shared_ptr_access<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  std::shared_ptr<QPDFOutlineObjectHelper>::operator=(&peVar1->parent,&local_20);
  std::shared_ptr<QPDFOutlineObjectHelper>::~shared_ptr(&local_20);
  std::shared_ptr<QPDFOutlineObjectHelper::Members>::~shared_ptr(&this->m);
  QPDFObjectHelper::~QPDFObjectHelper(&this->super_QPDFObjectHelper);
  return;
}

Assistant:

~QPDFOutlineObjectHelper() override
    {
        // This must be cleared explicitly to avoid circular references that prevent cleanup of
        // shared pointers.
        m->parent = nullptr;
    }